

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O0

void __thiscall ipx::Control::hIntervalLog(Control *this,stringstream *logging)

{
  undefined8 uVar1;
  string *in_RSI;
  long in_RDI;
  double dVar2;
  HighsLogOptions log_options_;
  HighsLogOptions *in_stack_fffffffffffffef8;
  HighsLogOptions *in_stack_ffffffffffffff00;
  string local_e0 [32];
  string local_c0 [48];
  string local_90 [32];
  HighsLogOptions local_70;
  string *local_10;
  
  local_10 = in_RSI;
  if ((0.0 <= *(double *)(in_RDI + 0x10)) &&
     (dVar2 = Timer::Elapsed((Timer *)in_stack_ffffffffffffff00),
     *(double *)(in_RDI + 0x10) <= dVar2)) {
    Timer::Reset((Timer *)in_stack_ffffffffffffff00);
    if ((*(byte *)(in_RDI + 0xe4) & 1) == 0) {
      std::__cxx11::stringstream::str();
      std::operator<<((ostream *)(in_RDI + 0x308),local_c0);
      std::__cxx11::string::~string(local_c0);
    }
    else {
      HighsLogOptions::HighsLogOptions(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      std::__cxx11::stringstream::str();
      uVar1 = std::__cxx11::string::c_str();
      highsLogUser(&local_70,kInfo,"%s",uVar1);
      std::__cxx11::string::~string(local_90);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x814a28);
    }
  }
  std::__cxx11::string::string(local_e0);
  std::__cxx11::stringstream::str(local_10);
  std::__cxx11::string::~string(local_e0);
  return;
}

Assistant:

void Control::hIntervalLog(std::stringstream& logging) const {
  if (parameters_.print_interval >= 0.0 &&
      interval_.Elapsed() >= parameters_.print_interval) {
    interval_.Reset();
    if (parameters_.highs_logging) {
      assert(parameters_.log_options);
      HighsLogOptions log_options_ = *(parameters_.log_options);
      highsLogUser(log_options_, HighsLogType::kInfo, "%s", logging.str().c_str());
    } else {
      output_ << logging.str();
    }
  }
  logging.str(std::string());
}